

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

int __thiscall QMetaObjectBuilder::indexOfProperty(QMetaObjectBuilder *this,QByteArray *name)

{
  pointer pQVar1;
  pointer pQVar2;
  bool bVar3;
  int unaff_EBX;
  pointer pQVar4;
  pointer rhs;
  
  rhs = (this->d->properties).
        super__Vector_base<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pQVar1 = (this->d->properties).
           super__Vector_base<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pQVar4 = rhs;
  while( true ) {
    if (rhs == pQVar1) {
      return -1;
    }
    bVar3 = ::operator==(name,&rhs->name);
    if (bVar3) {
      pQVar2 = (this->d->properties).
               super__Vector_base<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pQVar2 == (this->d->properties).
                    super__Vector_base<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        indexOfProperty();
      }
      unaff_EBX = (int)((ulong)((long)pQVar4 - (long)pQVar2) >> 3) * 0x38e38e39;
    }
    if (bVar3) break;
    rhs = (pointer)((long)rhs + 0x48);
    pQVar4 = (pointer)((long)pQVar4 + 0x48);
  }
  return unaff_EBX;
}

Assistant:

int QMetaObjectBuilder::indexOfProperty(const QByteArray &name)
{
    for (const auto &property : d->properties) {
        if (name == property.name)
            return int(&property - &d->properties.front());
    }
    return -1;
}